

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

PatchList re2::PatchList::Deref(Inst *inst0,PatchList l)

{
  if ((l.p & 1) == 0) {
    return (PatchList)(inst0[l.p >> 1].out_opcode_ >> 4);
  }
  if ((inst0[l.p >> 1].out_opcode_ & 6) == 0) {
    return (PatchList)inst0[l.p >> 1].field_1;
  }
  __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h",0x6d,
                "int re2::Prog::Inst::out1()");
}

Assistant:

PatchList PatchList::Deref(Prog::Inst* inst0, PatchList l) {
  Prog::Inst* ip = &inst0[l.p>>1];
  if (l.p&1)
    l.p = ip->out1();
  else
    l.p = ip->out();
  return l;
}